

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::
     verifyRecursive<float>
               (AtomicOperation operation,int index,float valueSoFar,bool (*argsUsed) [5],
               float (*args) [5],float (*returnValues) [5])

{
  bool bVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  bVar1 = true;
  if (index < 5) {
    uVar2 = 0xffffffffffffffff;
    do {
      if ((*argsUsed)[uVar2 + 1] == false) {
        fVar4 = (*returnValues)[uVar2 + 1] - valueSoFar;
        fVar3 = -fVar4;
        if (-fVar4 <= fVar4) {
          fVar3 = fVar4;
        }
        if (fVar3 <= 0.01) {
          (*argsUsed)[uVar2 + 1] = true;
          if (operation == ATOMIC_OPERATION_EXCHANGE) {
            fVar3 = (*args)[uVar2 + 1];
          }
          else {
            fVar3 = -1.0;
          }
          bVar1 = verifyRecursive<float>(operation,index + 1,fVar3,argsUsed,args,returnValues);
          if (bVar1) {
            return true;
          }
          (*argsUsed)[uVar2 + 1] = false;
        }
      }
      uVar2 = uVar2 + 1;
      bVar1 = uVar2 < 4;
    } while (uVar2 != 4);
  }
  return bVar1;
}

Assistant:

static bool verifyRecursive (AtomicOperation operation, int index, T valueSoFar, bool (&argsUsed)[NUM_INVOCATIONS_PER_PIXEL], const T (&args)[NUM_INVOCATIONS_PER_PIXEL], const T (&returnValues)[NUM_INVOCATIONS_PER_PIXEL])
	{
		if (index < NUM_INVOCATIONS_PER_PIXEL)
		{
			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				if (!argsUsed[i] && compare(returnValues[i], valueSoFar))
				{
					argsUsed[i] = true;
					if (verifyRecursive(operation, index+1, computeBinaryAtomicOperationResult(operation, valueSoFar, args[i]), argsUsed, args, returnValues))
						return true;
					argsUsed[i] = false;
				}
			}

			return false;
		}
		else
			return true;
	}